

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckInt(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,int64_t i)

{
  bool bVar1;
  ValueType *pVVar2;
  Ch *pCVar3;
  int64_t iVar4;
  uint64_t uVar5;
  ValidateErrorCode VVar6;
  ulong local_60;
  int64_t i_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->type_ & 0x60) == 0) {
    pVVar2 = GetIntegerString();
    DisallowedType(this,context,pVVar2);
    context->invalidCode = kValidateErrorType;
    pVVar2 = GetValidateErrorKeyword(kValidateErrorType);
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    context->invalidKeyword = pCVar3;
    return false;
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->minimum_);
  if (!bVar1) {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsInt64(&this->minimum_);
    if (bVar1) {
      if ((this->exclusiveMinimum_ & 1U) == 0) {
        iVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetInt64
                          (&this->minimum_);
        if (i < iVar4) goto LAB_00185e57;
      }
      else {
        iVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetInt64
                          (&this->minimum_);
        if (i <= iVar4) {
LAB_00185e57:
          (*context->error_handler->_vptr_IValidationErrorHandler[8])
                    (context->error_handler,i,&this->minimum_,(ulong)(this->exclusiveMinimum_ & 1));
          VVar6 = kValidateErrorMinimum;
          if ((this->exclusiveMinimum_ & 1U) != 0) {
            VVar6 = kValidateErrorExclusiveMinimum;
          }
          context->invalidCode = VVar6;
          VVar6 = kValidateErrorMinimum;
          if ((this->exclusiveMinimum_ & 1U) != 0) {
            VVar6 = kValidateErrorExclusiveMinimum;
          }
          pVVar2 = GetValidateErrorKeyword(VVar6);
          pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pVVar2);
          context->invalidKeyword = pCVar3;
          return false;
        }
      }
    }
    else {
      bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint64
                        (&this->minimum_);
      if (bVar1) {
        (*context->error_handler->_vptr_IValidationErrorHandler[8])
                  (context->error_handler,i,&this->minimum_,(ulong)(this->exclusiveMinimum_ & 1));
        VVar6 = kValidateErrorMinimum;
        if ((this->exclusiveMinimum_ & 1U) != 0) {
          VVar6 = kValidateErrorExclusiveMinimum;
        }
        context->invalidCode = VVar6;
        VVar6 = kValidateErrorMinimum;
        if ((this->exclusiveMinimum_ & 1U) != 0) {
          VVar6 = kValidateErrorExclusiveMinimum;
        }
        pVVar2 = GetValidateErrorKeyword(VVar6);
        pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar2);
        context->invalidKeyword = pCVar3;
        return false;
      }
      bVar1 = CheckDoubleMinimum(this,context,(double)i);
      if (!bVar1) {
        return false;
      }
    }
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->maximum_);
  if (!bVar1) {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsInt64(&this->maximum_);
    if (bVar1) {
      if ((this->exclusiveMaximum_ & 1U) == 0) {
        iVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetInt64
                          (&this->maximum_);
        if (iVar4 < i) goto LAB_00186036;
      }
      else {
        iVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetInt64
                          (&this->maximum_);
        if (iVar4 <= i) {
LAB_00186036:
          (*context->error_handler->_vptr_IValidationErrorHandler[5])
                    (context->error_handler,i,&this->maximum_,(ulong)(this->exclusiveMaximum_ & 1));
          VVar6 = kValidateErrorMaximum;
          if ((this->exclusiveMaximum_ & 1U) != 0) {
            VVar6 = kValidateErrorExclusiveMaximum;
          }
          context->invalidCode = VVar6;
          VVar6 = kValidateErrorMaximum;
          if ((this->exclusiveMaximum_ & 1U) != 0) {
            VVar6 = kValidateErrorExclusiveMaximum;
          }
          pVVar2 = GetValidateErrorKeyword(VVar6);
          pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pVVar2);
          context->invalidKeyword = pCVar3;
          return false;
        }
      }
    }
    else {
      bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint64
                        (&this->maximum_);
      if ((!bVar1) && (bVar1 = CheckDoubleMaximum(this,context,(double)i), !bVar1)) {
        return false;
      }
    }
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->multipleOf_);
  if (!bVar1) {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint64
                      (&this->multipleOf_);
    if (bVar1) {
      local_60 = i;
      if (i < 0) {
        local_60 = -i;
      }
      uVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                        (&this->multipleOf_);
      if (local_60 % uVar5 != 0) {
        (*context->error_handler->_vptr_IValidationErrorHandler[2])
                  (context->error_handler,i,&this->multipleOf_);
        context->invalidCode = kValidateErrorMultipleOf;
        pVVar2 = GetValidateErrorKeyword(kValidateErrorMultipleOf);
        pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar2);
        context->invalidKeyword = pCVar3;
        return false;
      }
    }
    else {
      bVar1 = CheckDoubleMultipleOf(this,context,(double)i);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool CheckInt(Context& context, int64_t i) const {
        if (!(type_ & ((1 << kIntegerSchemaType) | (1 << kNumberSchemaType)))) {
            DisallowedType(context, GetIntegerString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull()) {
            if (minimum_.IsInt64()) {
                if (exclusiveMinimum_ ? i <= minimum_.GetInt64() : i < minimum_.GetInt64()) {
                    context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
                }
            }
            else if (minimum_.IsUint64()) {
                context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum); // i <= max(int64_t) < minimum.GetUint64()
            }
            else if (!CheckDoubleMinimum(context, static_cast<double>(i)))
                return false;
        }

        if (!maximum_.IsNull()) {
            if (maximum_.IsInt64()) {
                if (exclusiveMaximum_ ? i >= maximum_.GetInt64() : i > maximum_.GetInt64()) {
                    context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
                }
            }
            else if (maximum_.IsUint64()) { }
                /* do nothing */ // i <= max(int64_t) < maximum_.GetUint64()
            else if (!CheckDoubleMaximum(context, static_cast<double>(i)))
                return false;
        }

        if (!multipleOf_.IsNull()) {
            if (multipleOf_.IsUint64()) {
                if (static_cast<uint64_t>(i >= 0 ? i : -i) % multipleOf_.GetUint64() != 0) {
                    context.error_handler.NotMultipleOf(i, multipleOf_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
                }
            }
            else if (!CheckDoubleMultipleOf(context, static_cast<double>(i)))
                return false;
        }

        return true;
    }